

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O0

void __thiscall
Salsa20Cipher::processBytes(Salsa20Cipher *this,uint8_t *in,uint8_t *out,size_t byteCount)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong in_RCX;
  byte *in_RDX;
  byte *in_RSI;
  uint8_t *in_stack_00000008;
  Salsa20Cipher *in_stack_00000010;
  uint i;
  size_t count;
  uint8_t keyStream [64];
  ulong local_88;
  uint local_74;
  byte local_68 [72];
  ulong local_20;
  byte *local_18;
  byte *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while (local_20 != 0) {
    generateKeyStream(in_stack_00000010,in_stack_00000008);
    if (local_20 < 0x40) {
      local_88 = local_20;
    }
    else {
      local_88 = 0x40;
    }
    for (local_74 = 0; pbVar2 = local_10, pbVar1 = local_18, local_74 < local_88;
        local_74 = local_74 + 1) {
      local_10 = local_10 + 1;
      local_18 = local_18 + 1;
      *pbVar1 = local_68[local_74] ^ *pbVar2;
      local_20 = local_20 - 1;
    }
  }
  return;
}

Assistant:

void processBytes(const uint8_t* in, uint8_t* out, size_t byteCount)
	{
		uint8_t keyStream[BLOCK_SIZE];

		while (byteCount != 0) {
			generateKeyStream(keyStream);

			const auto count = byteCount < BLOCK_SIZE ? byteCount : BLOCK_SIZE;
			for (auto i = 0u; i < count; ++i, --byteCount)
				*out++ = keyStream[i] ^ *in++;
		}
	}